

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void load_extensions(MOJOSHADER_glGetProcAddress lookup,void *d)

{
  int *piVar1;
  byte bVar2;
  bool bVar3;
  MOJOSHADER_glContext *pMVar4;
  int iVar5;
  GLenum GVar6;
  ulong in_RAX;
  StringCache *cache;
  GLubyte *pGVar7;
  char *pcVar8;
  byte *pbVar9;
  int *piVar10;
  GLuint GVar11;
  int iVar12;
  long lVar13;
  byte *str;
  GLint num_exts;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  cache = stringcache_create(ctx->malloc_fn,ctx->free_fn,ctx->malloc_data);
  pMVar4 = ctx;
  if (cache == (StringCache *)0x0) {
    builtin_strncpy(error_buffer + 8,"emory",6);
    builtin_strncpy(error_buffer,"out of m",8);
  }
  else {
    pMVar4->have_core_opengl = 1;
    pMVar4->have_opengl_2 = 1;
    pMVar4->have_opengl_3 = 1;
    pMVar4->have_GL_ARB_vertex_program = 1;
    pMVar4->have_GL_ARB_fragment_program = 1;
    pMVar4->have_GL_NV_vertex_program2_option = 1;
    pMVar4->have_GL_NV_fragment_program2 = 1;
    pMVar4->have_GL_NV_vertex_program3 = 1;
    pMVar4->have_GL_NV_gpu_program4 = 1;
    pMVar4->have_GL_ARB_shader_objects = 1;
    pMVar4->have_GL_ARB_vertex_shader = 1;
    pMVar4->have_GL_ARB_fragment_shader = 1;
    pMVar4->have_GL_ARB_shading_language_100 = 1;
    pMVar4->have_GL_NV_half_float = 1;
    pMVar4->have_GL_ARB_half_float_vertex = 1;
    pMVar4->have_GL_OES_vertex_half_float = 1;
    pMVar4->have_GL_ARB_instanced_arrays = 1;
    lookup_entry_points(lookup,d);
    if (ctx->have_core_opengl == 0) {
      builtin_strncpy(error_buffer,"missing basic OpenGL entry points",0x22);
    }
    else {
      pGVar7 = (*ctx->glGetString)(0x1f02);
      pcVar8 = strstr((char *)pGVar7,"OpenGL ES ");
      if (pcVar8 != (char *)0x0) {
        ctx->have_opengl_es = 1;
        pGVar7 = pGVar7 + 10;
      }
      piVar1 = &ctx->opengl_major;
      if (pGVar7 == (GLubyte *)0x0) {
        ctx->opengl_minor = 0;
        *piVar1 = 0;
      }
      else {
        __isoc99_sscanf(pGVar7,"%d.%d");
      }
      if ((ctx->have_opengl_3 == 0) ||
         ((int)((uint)(ushort)ctx->opengl_minor | ctx->opengl_major << 0x10) < 0x30000)) {
        pbVar9 = (*ctx->glGetString)(0x1f03);
        ctx->have_opengl_3 = 0;
        while ((str = pbVar9, (ulong)*pbVar9 < 0x21 &&
               ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0))) {
          pbVar9 = pbVar9 + 1;
        }
        do {
          bVar2 = *pbVar9;
          if ((bVar2 == 0) || ((bVar2 < 0x21 && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)))
             ) {
            if ((pbVar9 == str) ||
               (pcVar8 = stringcache_len(cache,(char *)str,(int)pbVar9 - (int)str),
               pcVar8 != (char *)0x0)) {
              if (bVar2 != 0) {
                do {
                  pbVar9 = pbVar9 + 1;
                  if (0x20 < (ulong)*pbVar9) break;
                } while ((0x100002600U >> ((ulong)*pbVar9 & 0x3f) & 1) != 0);
                bVar3 = false;
                str = pbVar9;
                goto LAB_0012162c;
              }
            }
            else {
              builtin_strncpy(error_buffer + 8,"emory",6);
              builtin_strncpy(error_buffer,"out of m",8);
            }
            bVar3 = true;
          }
          else {
            pbVar9 = pbVar9 + 1;
            bVar3 = false;
          }
LAB_0012162c:
        } while (!bVar3);
      }
      else {
        uStack_38 = uStack_38 & 0xffffffff;
        (*ctx->glGetIntegerv)(0x821d,(GLint *)((long)&uStack_38 + 4));
        if (0 < uStack_38._4_4_) {
          GVar11 = 0;
          do {
            pGVar7 = (*ctx->glGetStringi)(0x1f03,GVar11);
            pcVar8 = stringcache(cache,(char *)pGVar7);
            if (pcVar8 == (char *)0x0) {
              builtin_strncpy(error_buffer + 8,"emory",6);
              builtin_strncpy(error_buffer,"out of m",8);
            }
            GVar11 = GVar11 + 1;
          } while ((int)GVar11 < uStack_38._4_4_);
        }
      }
    }
    pMVar4 = ctx;
    if ((ctx->have_opengl_2 != 0) &&
       ((int)((uint)(ushort)ctx->opengl_minor | ctx->opengl_major << 0x10) < 0x20000)) {
      ctx->have_opengl_2 = 0;
      pMVar4->glUniform1i = pMVar4->glUniform1iARB;
      pMVar4->glUniform4fv = pMVar4->glUniform4fvARB;
      pMVar4->glUniform4iv = pMVar4->glUniform4ivARB;
      pMVar4->glDisableVertexAttribArray = pMVar4->glDisableVertexAttribArrayARB;
      pMVar4->glEnableVertexAttribArray = pMVar4->glEnableVertexAttribArrayARB;
      pMVar4->glVertexAttribPointer = pMVar4->glVertexAttribPointerARB;
    }
    iVar5 = 0;
    if ((pMVar4->have_GL_ARB_vertex_program != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar5 = stringcache_iscached(cache,"GL_ARB_vertex_program");
    }
    pMVar4 = ctx;
    ctx->have_GL_ARB_vertex_program = iVar5;
    iVar5 = 0;
    if ((pMVar4->have_GL_ARB_fragment_program != 0) && (iVar5 = 0, pMVar4->have_core_opengl != 0)) {
      iVar5 = stringcache_iscached(cache,"GL_ARB_fragment_program");
    }
    pMVar4 = ctx;
    ctx->have_GL_ARB_fragment_program = iVar5;
    iVar12 = 0;
    iVar5 = 0;
    if ((pMVar4->have_GL_ARB_shader_objects != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar5 = stringcache_iscached(cache,"GL_ARB_shader_objects");
    }
    pMVar4 = ctx;
    ctx->have_GL_ARB_shader_objects = iVar5;
    if ((pMVar4->have_GL_ARB_vertex_shader != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar12 = stringcache_iscached(cache,"GL_ARB_vertex_shader");
    }
    pMVar4 = ctx;
    ctx->have_GL_ARB_vertex_shader = iVar12;
    iVar12 = 0;
    iVar5 = 0;
    if ((pMVar4->have_GL_ARB_fragment_shader != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar5 = stringcache_iscached(cache,"GL_ARB_fragment_shader");
    }
    pMVar4 = ctx;
    ctx->have_GL_ARB_fragment_shader = iVar5;
    if ((pMVar4->have_GL_ARB_shading_language_100 != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar12 = stringcache_iscached(cache,"GL_ARB_shading_language_100");
    }
    pMVar4 = ctx;
    ctx->have_GL_ARB_shading_language_100 = iVar12;
    iVar12 = 0;
    iVar5 = 0;
    if ((pMVar4->have_GL_NV_vertex_program2_option != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar5 = stringcache_iscached(cache,"GL_NV_vertex_program2_option");
    }
    pMVar4 = ctx;
    ctx->have_GL_NV_vertex_program2_option = iVar5;
    if ((pMVar4->have_GL_NV_fragment_program2 != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar12 = stringcache_iscached(cache,"GL_NV_fragment_program2");
    }
    pMVar4 = ctx;
    ctx->have_GL_NV_fragment_program2 = iVar12;
    iVar12 = 0;
    iVar5 = 0;
    if ((pMVar4->have_GL_NV_vertex_program3 != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar5 = stringcache_iscached(cache,"GL_NV_vertex_program3");
    }
    pMVar4 = ctx;
    ctx->have_GL_NV_vertex_program3 = iVar5;
    if ((pMVar4->have_GL_NV_half_float != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar12 = stringcache_iscached(cache,"GL_NV_half_float");
    }
    pMVar4 = ctx;
    ctx->have_GL_NV_half_float = iVar12;
    iVar12 = 0;
    iVar5 = verify_extension("GL_ARB_half_float_vertex",pMVar4->have_GL_ARB_half_float_vertex,cache,
                             3,0);
    pMVar4 = ctx;
    ctx->have_GL_ARB_half_float_vertex = iVar5;
    if ((pMVar4->have_GL_OES_vertex_half_float != 0) && (pMVar4->have_core_opengl != 0)) {
      iVar12 = stringcache_iscached(cache,"GL_OES_vertex_half_float");
    }
    pMVar4 = ctx;
    ctx->have_GL_OES_vertex_half_float = iVar12;
    iVar5 = verify_extension("GL_ARB_instanced_arrays",pMVar4->have_GL_ARB_instanced_arrays,cache,3,
                             3);
    ctx->have_GL_ARB_instanced_arrays = iVar5;
    stringcache_destroy(cache);
    pMVar4 = ctx;
    pMVar4->glsl_major = 0;
    pMVar4->glsl_minor = 0;
    if ((pMVar4->have_core_opengl != 0) &&
       ((pMVar4->have_opengl_2 != 0 ||
        ((((pMVar4->have_GL_ARB_shader_objects != 0 && (pMVar4->have_GL_ARB_vertex_shader != 0)) &&
          (pMVar4->have_GL_ARB_fragment_shader != 0)) &&
         (pMVar4->have_GL_ARB_shading_language_100 != 0)))))) {
      (*pMVar4->glGetError)();
      pGVar7 = (*ctx->glGetString)(0x8b8c);
      GVar6 = (*ctx->glGetError)();
      piVar1 = &ctx->glsl_major;
      piVar10 = &ctx->glsl_minor;
      if (pGVar7 == (GLubyte *)0x0 || GVar6 == 0x500) {
        *piVar10 = 0;
        *piVar1 = 0;
      }
      else {
        pcVar8 = strstr((char *)pGVar7,"OpenGL ES GLSL ");
        lVar13 = 0xf;
        if (pcVar8 == (char *)0x0) {
          lVar13 = 0;
        }
        pcVar8 = strstr((char *)(pGVar7 + lVar13),"ES ");
        __isoc99_sscanf(pGVar7 + lVar13 + (ulong)(pcVar8 != (char *)0x0) * 3,"%d.%d",piVar1,piVar10)
        ;
      }
    }
  }
  return;
}

Assistant:

static void load_extensions(MOJOSHADER_glGetProcAddress lookup, void *d)
{
    StringCache *exts = stringcache_create(ctx->malloc_fn, ctx->free_fn, ctx->malloc_data);
    if (!exts)
    {
        out_of_memory();
        return;
    } // if

    ctx->have_core_opengl = 1;
    ctx->have_opengl_2 = 1;
    ctx->have_opengl_3 = 1;
    ctx->have_GL_ARB_vertex_program = 1;
    ctx->have_GL_ARB_fragment_program = 1;
    ctx->have_GL_NV_vertex_program2_option = 1;
    ctx->have_GL_NV_fragment_program2 = 1;
    ctx->have_GL_NV_vertex_program3 = 1;
    ctx->have_GL_NV_gpu_program4 = 1;
    ctx->have_GL_ARB_shader_objects = 1;
    ctx->have_GL_ARB_vertex_shader = 1;
    ctx->have_GL_ARB_fragment_shader = 1;
    ctx->have_GL_ARB_shading_language_100 = 1;
    ctx->have_GL_NV_half_float = 1;
    ctx->have_GL_ARB_half_float_vertex = 1;
    ctx->have_GL_OES_vertex_half_float = 1;
    ctx->have_GL_ARB_instanced_arrays = 1;

    lookup_entry_points(lookup, d);

    if (!ctx->have_core_opengl)
        set_error("missing basic OpenGL entry points");
    else
    {
        const char *str = (const char *) ctx->glGetString(GL_VERSION);
        if (strstr(str, "OpenGL ES "))
        {
            ctx->have_opengl_es = 1;
            str += 10;
        }
        parse_opengl_version_str(str, &ctx->opengl_major, &ctx->opengl_minor);

        if ((ctx->have_opengl_3) && (opengl_version_atleast(3, 0)))
        {
            GLint i;
            GLint num_exts = 0;
            ctx->glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts);
            for (i = 0; i < num_exts; i++)
            {
                if (!stringcache(exts, (const char *) ctx->glGetStringi(GL_EXTENSIONS, i)))
                    out_of_memory();
            } // for
        } // if
        else
        {
            const char *str = (const char *) ctx->glGetString(GL_EXTENSIONS);
            const char *ext;
            ctx->have_opengl_3 = 0;

            while (*str && iswhitespace(*str))
                str++;
            ext = str;

            while (1)
            {
                const char ch = *str;
                if (ch && (!iswhitespace(ch)))
                {
                    str++;
                    continue;
                } // else if

                if (str != ext)
                {
                    if (!stringcache_len(exts, ext, (unsigned int) (str - ext)))
                    {
                        out_of_memory();
                        break;
                    } // if
                } // if

                if (ch == '\0')
                    break;

                str++;
                while (*str && iswhitespace(*str))
                    str++;
                ext = str;
            } // while
        } // else
    } // else

    if ((ctx->have_opengl_2) && (!opengl_version_atleast(2, 0)))
    {
        ctx->have_opengl_2 = 0;  // Not GL2! must have the ARB extensions!

        // Force compatible ARB function pointers in...this keeps the code
        //  cleaner when they are identical, so we don't have to if/else
        //  every function call, but we definitely have the right entry
        //  point. Be careful what you add here.
        // These may be NULL, btw.
        ctx->glUniform1i = ctx->glUniform1iARB;
        ctx->glUniform4fv = ctx->glUniform4fvARB;
        ctx->glUniform4iv = ctx->glUniform4ivARB;
        ctx->glDisableVertexAttribArray = ctx->glDisableVertexAttribArrayARB;
        ctx->glEnableVertexAttribArray = ctx->glEnableVertexAttribArrayARB;
        ctx->glVertexAttribPointer = ctx->glVertexAttribPointerARB;
    } // if

    #define VERIFY_EXT(ext, major, minor) \
        ctx->have_##ext = verify_extension(#ext, ctx->have_##ext, exts, major, minor)

    VERIFY_EXT(GL_ARB_vertex_program, -1, -1);
    VERIFY_EXT(GL_ARB_fragment_program, -1, -1);
    VERIFY_EXT(GL_ARB_shader_objects, -1, -1);
    VERIFY_EXT(GL_ARB_vertex_shader, -1, -1);
    VERIFY_EXT(GL_ARB_fragment_shader, -1, -1);
    VERIFY_EXT(GL_ARB_shading_language_100, -1, -1);
    VERIFY_EXT(GL_NV_vertex_program2_option, -1, -1);
    VERIFY_EXT(GL_NV_fragment_program2, -1, -1);
    VERIFY_EXT(GL_NV_vertex_program3, -1, -1);
    VERIFY_EXT(GL_NV_half_float, -1, -1);
    VERIFY_EXT(GL_ARB_half_float_vertex, 3, 0);
    VERIFY_EXT(GL_OES_vertex_half_float, -1, -1);
    VERIFY_EXT(GL_ARB_instanced_arrays, 3, 3);

    #undef VERIFY_EXT

    stringcache_destroy(exts);

    detect_glsl_version();
}